

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int mallocAndStrcpy_s(char **destination,char *source)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 local_40;
  size_t malloc_size;
  size_t l;
  char *temp;
  int copied_result;
  int result;
  char *source_local;
  char **destination_local;
  
  if ((destination == (char **)0x0) || (source == (char *)0x0)) {
    temp._4_4_ = 0x16;
  }
  else {
    sVar1 = strlen(source);
    if (sVar1 < 0xfffffffffffffffe) {
      local_40 = sVar1 + 1;
    }
    else {
      local_40 = 0xffffffffffffffff;
    }
    if ((local_40 == 0xffffffffffffffff) ||
       (pcVar2 = (char *)malloc(local_40), pcVar2 == (char *)0x0)) {
      temp._4_4_ = 0xc;
    }
    else {
      *destination = pcVar2;
      temp._4_4_ = strcpy_s(*destination,sVar1 + 1,source);
      if (temp._4_4_ == 0) {
        temp._4_4_ = 0;
      }
      else {
        free(*destination);
        *destination = (char *)0x0;
      }
    }
  }
  return temp._4_4_;
}

Assistant:

int mallocAndStrcpy_s(char** destination, const char* source)
{
    int result;
    int copied_result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_036: [destination parameter or source parameter is NULL, the error code returned shall be EINVAL and destination shall not be modified.]*/
    if ((destination == NULL) || (source == NULL))
    {
        /*If strDestination or strSource is a NULL pointer[...]these functions return EINVAL */
        result = EINVAL;
    }
    else
    {
        char* temp;
        size_t l = strlen(source);
        size_t malloc_size = safe_add_size_t(l, 1);

        /*Codes_SRS_CRT_ABSTRACTIONS_99_037: [Upon failure to allocate memory for the destination, the function will return ENOMEM.]*/
        if (malloc_size == SIZE_MAX ||
            (temp = (char*)malloc(malloc_size)) == NULL)
        {
            result = ENOMEM;
        }
        else
        {
            *destination = temp;
            /*Codes_SRS_CRT_ABSTRACTIONS_99_039: [mallocAndstrcpy_s shall copy the contents in the address source, including the terminating null character into location specified by the destination pointer after the memory allocation.]*/
            copied_result = strcpy_s(*destination, l + 1, source);
            if (copied_result != 0) /*strcpy_s error*/
            {
                free(*destination);
                *destination = NULL;
                result = copied_result;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_99_035: [mallocAndstrcpy_s shall return Zero upon success]*/
                result = 0;
            }
        }
    }
    return result;
}